

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int ddEpdCountMintermAux(DdNode *node,EpDouble *max,EpDouble *epd,st__table *table)

{
  DdNode *pDVar1;
  int iVar2;
  EpDouble *to;
  EpDouble *res;
  EpDouble minE;
  EpDouble minT;
  EpDouble *local_58;
  EpDouble local_50;
  EpDouble local_40;
  
  if (node->index == 0x7fffffff) {
    if ((background == node) || (local_58 = max, zero == node)) {
      EpdMakeZero(epd,0);
      return 0;
    }
  }
  else if ((node->ref == 1) ||
          (iVar2 = st__lookup(table,(char *)node,(char **)&local_58), iVar2 == 0)) {
    pDVar1 = (node->type).kids.E;
    iVar2 = ddEpdCountMintermAux((node->type).kids.T,max,&local_40,table);
    if (iVar2 != -1) {
      EpdMultiply(&local_40,0.5);
      iVar2 = ddEpdCountMintermAux
                        ((DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe),max,&local_50,table);
      if (iVar2 != -1) {
        if (((ulong)pDVar1 & 1) != 0) {
          EpdSubtract3(max,&local_50,epd);
          EpdCopy(epd,&local_50);
        }
        EpdMultiply(&local_50,0.5);
        EpdAdd3(&local_40,&local_50,epd);
        if (node->ref < 2) {
          return 0;
        }
        to = EpdAlloc();
        if (to != (EpDouble *)0x0) {
          EpdCopy(epd,to);
          iVar2 = st__insert(table,(char *)node,(char *)to);
          if (iVar2 != -10000) {
            return 0;
          }
          EpdFree(to);
        }
      }
    }
    return -1;
  }
  EpdCopy(local_58,epd);
  return 0;
}

Assistant:

static int
ddEpdCountMintermAux(
  DdNode * node,
  EpDouble * max,
  EpDouble * epd,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    EpDouble    *min, minT, minE;
    EpDouble    *res;
    int         status;

    /* node is assumed to be regular */
    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            EpdMakeZero(epd, 0);
        } else {
            EpdCopy(max, epd);
        }
        return(0);
    }
    if (node->ref != 1 && st__lookup(table, (const char *)node, (char **)&res)) {
        EpdCopy(res, epd);
        return(0);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    status = ddEpdCountMintermAux(Nt,max,&minT,table);
    if (status == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    EpdMultiply(&minT, (double)0.5);
    status = ddEpdCountMintermAux(Cudd_Regular(Ne),max,&minE,table);
    if (status == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    if (Cudd_IsComplement(Ne)) {
        EpdSubtract3(max, &minE, epd);
        EpdCopy(epd, &minE);
    }
    EpdMultiply(&minE, (double)0.5);
    EpdAdd3(&minT, &minE, epd);

    if (node->ref > 1) {
        min = EpdAlloc();
        if (!min)
            return(CUDD_OUT_OF_MEM);
        EpdCopy(epd, min);
        if ( st__insert(table, (char *)node, (char *)min) == st__OUT_OF_MEM) {
            EpdFree(min);
            return(CUDD_OUT_OF_MEM);
        }
    }

    return(0);

}